

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hex.c
# Opt level: O0

bool_t hexEqRev_fast(void *buf,char *hex)

{
  octet oVar1;
  octet oVar2;
  long in_RSI;
  octet *in_RDI;
  size_t count;
  size_t local_20;
  char *local_18;
  octet *local_10;
  
  local_20 = strLen((char *)0x11b0b8);
  local_18 = (char *)(in_RSI + local_20);
  local_10 = in_RDI;
  while( true ) {
    if (local_20 == 0) {
      return 1;
    }
    oVar1 = *local_10;
    local_18 = local_18 + -2;
    oVar2 = hexToO(local_18);
    if (oVar1 != oVar2) break;
    local_20 = local_20 - 2;
    local_10 = local_10 + 1;
  }
  return 0;
}

Assistant:

bool_t FAST(hexEqRev)(const void* buf, const char* hex)
{
	size_t count;
	ASSERT(hexIsValid(hex));
	ASSERT(memIsValid(buf, strLen(hex) / 2));
	count = strLen(hex);
	hex = hex + count;
	for (; count; count -= 2, buf = (const octet*)buf + 1)
		if (*(const octet*)buf != hexToO(hex -= 2))
			return FALSE;
	return TRUE;
}